

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.hpp
# Opt level: O0

void __thiscall jsonip::writer<true>::pre(writer<true> *this)

{
  ostream *poVar1;
  string local_30;
  writer<true> *local_10;
  writer<true> *this_local;
  
  if ((this->comma & 1U) != 0) {
    local_10 = this;
    poVar1 = std::operator<<(this->os,",");
    poVar1 = std::operator<<(poVar1,'\n');
    indent_abi_cxx11_(&local_30,this);
    std::operator<<(poVar1,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void pre()
        {
            if (indent_)
            {
                if (comma)
                    os << "," << '\n' << indent();
            }
            else
            {
                if (comma)
                    os << ", ";
            }
        }